

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O0

int __thiscall
MediaManager::GetType
          (MediaManager *this,
          vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_> *wanted_types)

{
  MediaType MVar1;
  bool bVar2;
  MediaType MVar3;
  reference ppIVar4;
  reference pMVar5;
  MediaType *wanted_type;
  iterator __end2;
  iterator __begin2;
  vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_> *__range2;
  int local_result;
  IMedia **it;
  iterator __end1;
  iterator __begin1;
  vector<IMedia_*,_std::allocator<IMedia_*>_> *__range1;
  int nb_media;
  int result;
  vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_> *wanted_types_local;
  MediaManager *this_local;
  
  __range1._4_4_ = MEDIA_UNDEF;
  __range1._0_4_ = 0;
  __end1 = std::vector<IMedia_*,_std::allocator<IMedia_*>_>::begin(&this->media_list_);
  it = (IMedia **)std::vector<IMedia_*,_std::allocator<IMedia_*>_>::end(&this->media_list_);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<IMedia_**,_std::vector<IMedia_*,_std::allocator<IMedia_*>_>_>
                                *)&it);
    if (!bVar2) {
      return __range1._4_4_;
    }
    ppIVar4 = __gnu_cxx::
              __normal_iterator<IMedia_**,_std::vector<IMedia_*,_std::allocator<IMedia_*>_>_>::
              operator*(&__end1);
    __range2._4_4_ = MEDIA_UNDEF;
    __end2 = std::vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_>::begin
                       (wanted_types);
    wanted_type = (MediaType *)
                  std::vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_>::
                  end(wanted_types);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<MediaManager::MediaType_*,_std::vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_>_>
                                       *)&wanted_type), bVar2) {
      pMVar5 = __gnu_cxx::
               __normal_iterator<MediaManager::MediaType_*,_std::vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_>_>
               ::operator*(&__end2);
      MVar1 = *pMVar5;
      MVar3 = (**(*ppIVar4)->_vptr_IMedia)();
      if (MVar1 == MVar3) {
        __range2._4_4_ = *pMVar5;
        break;
      }
      __gnu_cxx::
      __normal_iterator<MediaManager::MediaType_*,_std::vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_>_>
      ::operator++(&__end2);
    }
    if (((__range1._4_4_ != MEDIA_UNDEF) && (__range2._4_4_ != MEDIA_UNDEF)) &&
       (__range2._4_4_ != __range1._4_4_)) {
      return 0;
    }
    if ((__range2._4_4_ == MEDIA_DISK) && (1 < (int)__range1)) {
      return 0;
    }
    __range1._4_4_ = __range2._4_4_;
    __range1._0_4_ = (int)__range1 + 1;
    __gnu_cxx::__normal_iterator<IMedia_**,_std::vector<IMedia_*,_std::allocator<IMedia_*>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

int MediaManager::GetType(std::vector<MediaType> wanted_types)
{
   int result = MEDIA_UNDEF;
   int nb_media = 0;
   for (auto& it : media_list_)
   {
      // Maybe a use of Strategy pattern would do the job
      // RULES :
      // - Do not keep unwanted types
      int local_result = MEDIA_UNDEF;
      for (auto& wanted_type : wanted_types)
      {
         if (wanted_type == it->GetType())
         {
            local_result = wanted_type;
            break;
         }
      }
      // - No mixed types
      if (result != MEDIA_UNDEF && local_result != MEDIA_UNDEF && local_result != result)
      {
         return MEDIA_UNDEF;
      }
      // - No more than 2 DISK
      if (local_result == MEDIA_DISK && nb_media >= 2)
      {
         return MEDIA_UNDEF;
      }
      else
      {
         // - Unlimited number of tracks or ROM
         // - No more than 1 of any other
      }
      result = local_result;
      nb_media++;
   }
   return result;
}